

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmain.cc
# Opt level: O0

int audio_main(void)

{
  double dVar1;
  Api api;
  Api api_00;
  FILE *pFVar2;
  bool bVar3;
  uint uVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  undefined8 uVar8;
  double dVar9;
  allocator local_261;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  allocator local_1d9;
  string local_1d8;
  undefined1 local_1b8 [8];
  string midi_port_name;
  RtAudioErrorType err;
  uint buffer_size;
  double latency;
  StreamOptions stream_opts;
  StreamParameters stream_param;
  uint sample_rate;
  DeviceInfo device_info;
  uint output_device_id;
  allocator local_d9;
  uint num_audio_devices;
  undefined1 local_b8 [8];
  RtMidiIn midi_client;
  _func_void_RtAudioErrorType_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  *local_98;
  RtAudioErrorCallback local_90;
  RtAudio local_70;
  RtAudio audio_client;
  Ring_Buffer midi_rb;
  Audio_Context ctx;
  
  Audio_Context::Audio_Context((Audio_Context *)&midi_rb.rbdata_);
  Ring_Buffer_Ex<true>::Ring_Buffer_Ex((Ring_Buffer_Ex<true> *)&audio_client,0x10000);
  api = arg_audio_api;
  local_98 = audio_error_callback;
  midi_rb.rbdata_._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       &audio_client;
  std::function<void(RtAudioErrorType,std::__cxx11::string_const&)>::
  function<void(*)(RtAudioErrorType,std::__cxx11::string_const&),void>
            ((function<void(RtAudioErrorType,std::__cxx11::string_const&)> *)&local_90,&local_98);
  RtAudio::RtAudio(&local_70,api,&local_90);
  std::
  function<void_(RtAudioErrorType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_90);
  api_00 = arg_midi_api;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&num_audio_devices,"ADLrt",&local_d9);
  RtMidiIn::RtMidiIn((RtMidiIn *)local_b8,api_00,(string *)&num_audio_devices,0x10000);
  std::__cxx11::string::~string((string *)&num_audio_devices);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  uVar4 = RtAudio::getDeviceCount(&local_70);
  pFVar2 = _stderr;
  if (uVar4 == 0) {
    pcVar5 = _("No audio devices are present for output.");
    fprintf(pFVar2,"%s\n",pcVar5);
    ctx.midi_timestamp_accum._4_4_ = 1;
  }
  else {
    uVar4 = RtAudio::getDefaultOutputDevice(&local_70);
    RtAudio::getDeviceInfo((DeviceInfo *)&stream_param.firstChannel,&local_70,uVar4);
    stream_param.nChannels =
         device_info.sampleRates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    RtAudio::StreamParameters::StreamParameters((StreamParameters *)&stream_opts.priority);
    stream_opts._44_4_ = 2;
    stream_opts.priority = uVar4;
    RtAudio::StreamOptions::StreamOptions((StreamOptions *)&latency);
    latency._0_4_ = 0x10;
    if ((arg_autoconnect & 1U) == 0) {
      latency._0_4_ = 0x30;
    }
    std::__cxx11::string::operator=((string *)&stream_opts,"ADLrt");
    dVar1 = arg_latency;
    dVar9 = ceil(arg_latency * (double)stream_param.nChannels);
    pFVar2 = _stderr;
    midi_port_name.field_2._12_4_ = (undefined4)(long)dVar9;
    pcVar5 = _("Desired latency %f ms = buffer size %u\n");
    fprintf(pFVar2,pcVar5,dVar1 * 1000.0,(ulong)(uint)midi_port_name.field_2._12_4_);
    midi_port_name.field_2._8_4_ =
         RtAudio::openStream(&local_70,(StreamParameters *)&stream_opts.priority,
                             (StreamParameters *)0x0,0x10,stream_param.nChannels,
                             (uint *)(midi_port_name.field_2._M_local_buf + 0xc),process,
                             &midi_rb.rbdata_,(StreamOptions *)&latency);
    if ((midi_port_name.field_2._8_4_ == RTAUDIO_NO_ERROR) ||
       (midi_port_name.field_2._8_4_ == RTAUDIO_WARNING)) {
      RtMidiIn::setCallback((RtMidiIn *)local_b8,rtmidi_event,&midi_rb.rbdata_);
      RtMidiIn::setErrorCallback((RtMidiIn *)local_b8,midi_error_callback,(void *)0x0);
      std::__cxx11::string::string((string *)local_1b8);
      RtMidiIn::getCurrentApi((RtMidiIn *)local_b8);
      std::__cxx11::string::operator=((string *)local_1b8,"ADLrt MIDI");
      pcVar5 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1d8,pcVar5,&local_1d9);
      RtMidiIn::openVirtualPort((RtMidiIn *)local_b8,&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_260,"ADLrt",&local_261);
      std::operator+(&local_240,&local_260," [");
      std::operator+(&local_220,&local_240,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8)
      ;
      std::operator+(&local_200,&local_220,"]");
      std::__cxx11::string::operator=((string *)&program_title_abi_cxx11_,(string *)&local_200);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_260);
      std::allocator<char>::~allocator((allocator<char> *)&local_261);
      pFVar2 = _stderr;
      uVar6 = (ulong)(uint)midi_port_name.field_2._12_4_;
      uVar7 = (ulong)stream_param.nChannels;
      pcVar5 = _("RtAudio client \"%s\" fs=%u bs=%u latency=%f\n");
      uVar8 = std::__cxx11::string::c_str();
      fprintf(pFVar2,pcVar5,(double)uVar6 / (double)uVar7,uVar8,(ulong)stream_param.nChannels,
              (ulong)(uint)midi_port_name.field_2._12_4_);
      bVar3 = initialize_player(arg_player_type,stream_param.nChannels,arg_nchip,arg_bankfile,
                                arg_emulator,false);
      if (bVar3) {
        RtAudio::startStream(&local_70);
        player_ready(false);
        interface_exec((_func_void_void_ptr *)0x0,(void *)0x0);
        RtAudio::stopStream(&local_70);
        RtMidiIn::closePort((RtMidiIn *)local_b8);
      }
      ctx.midi_timestamp_accum._5_3_ = 0;
      ctx.midi_timestamp_accum._4_1_ = !bVar3;
      std::__cxx11::string::~string((string *)local_1b8);
    }
    else {
      ctx.midi_timestamp_accum._4_4_ = 1;
    }
    RtAudio::StreamOptions::~StreamOptions((StreamOptions *)&latency);
    RtAudio::DeviceInfo::~DeviceInfo((DeviceInfo *)&stream_param.firstChannel);
  }
  RtMidiIn::~RtMidiIn((RtMidiIn *)local_b8);
  RtAudio::~RtAudio(&local_70);
  Ring_Buffer_Ex<true>::~Ring_Buffer_Ex((Ring_Buffer_Ex<true> *)&audio_client);
  return ctx.midi_timestamp_accum._4_4_;
}

Assistant:

int audio_main()
{
    Audio_Context ctx;
    Ring_Buffer midi_rb(midi_buffer_size);
    ctx.midi_rb = &midi_rb;

#if defined(RTAUDIO_VERSION_6)
    RtAudio audio_client(::arg_audio_api, &audio_error_callback);
#else
    RtAudio audio_client(::arg_audio_api);
#endif
    ctx.audio_client = &audio_client;
    RtMidiIn midi_client(::arg_midi_api, "ADLrt", midi_buffer_size);
    ctx.midi_client = &midi_client;

    unsigned num_audio_devices = audio_client.getDeviceCount();
    if (num_audio_devices == 0) {
        fprintf(stderr, "%s\n", _("No audio devices are present for output."));
        return 1;
    }

    unsigned output_device_id = audio_client.getDefaultOutputDevice();
    RtAudio::DeviceInfo device_info = audio_client.getDeviceInfo(output_device_id);
    unsigned sample_rate = device_info.preferredSampleRate;
    ctx.sample_rate = sample_rate;

    RtAudio::StreamParameters stream_param;
    stream_param.deviceId = output_device_id;
    stream_param.nChannels = 2;

    RtAudio::StreamOptions stream_opts;
    stream_opts.flags = RTAUDIO_ALSA_USE_DEFAULT;
    if (!arg_autoconnect)
        stream_opts.flags |= RTAUDIO_JACK_DONT_CONNECT;
    stream_opts.streamName = "ADLrt";

    double latency = ::arg_latency;
    unsigned buffer_size = ceil(latency * sample_rate);
    fprintf(stderr, _("Desired latency %f ms = buffer size %u\n"),
            latency * 1e3, buffer_size);

#if defined(RTAUDIO_VERSION_6)
    RtAudioErrorType err = audio_client.openStream(&stream_param, nullptr, RTAUDIO_FLOAT32,
                                                   sample_rate, &buffer_size, &process,
                                                   &ctx, &stream_opts);

    if(err != RTAUDIO_NO_ERROR && err != RTAUDIO_WARNING)
        return 1;
#else
    audio_client.openStream(
        &stream_param, nullptr, RTAUDIO_FLOAT32, sample_rate, &buffer_size,
        &process, &ctx, &stream_opts, &audio_error_callback);
#endif

    midi_client.setCallback(&rtmidi_event, &ctx);
    midi_client.setErrorCallback(&midi_error_callback);

#if defined(ADLJACK_ENABLE_VIRTUALMIDI)
    VM_MIDI_PORT_u vmidi_port;
    ctx.have_virtualmidi = vmidi_init();
#endif

    std::string midi_port_name;

    switch (midi_client.getCurrentApi()) {
    default:
        midi_port_name = "ADLrt MIDI";
        midi_client.openVirtualPort(midi_port_name.c_str());
        break;
#if defined(_WIN32)
    case RtMidi::WINDOWS_MM: {
        switch(int port = dlg_select_midi_port(ctx)) {
        default:
            midi_client.openPort(port, "ADLrt MIDI");
            midi_port_name = midi_client.getPortName(port);
            break;
        case -1:
            return 1;
#if defined(ADLJACK_ENABLE_VIRTUALMIDI)
        case -2:
            vmidi_port = vmidi_port_setup(ctx, midi_port_name);
            if (!vmidi_port)
                return 1;
            ctx.vmidi_port = vmidi_port.get();
            break;
#endif
        }
        break;
    }
#endif
    }

    ::program_title = std::string("ADLrt") + " [" + midi_port_name + "]";

    latency = buffer_size / (double)sample_rate;
    fprintf(stderr, _("RtAudio client \"%s\" fs=%u bs=%u latency=%f\n"),
            device_info.name.c_str(), sample_rate, buffer_size, latency);

    if (!initialize_player(arg_player_type, sample_rate, arg_nchip, arg_bankfile, arg_emulator))
        return 1;

    audio_client.startStream();
    player_ready();

    //
    interface_exec(nullptr, nullptr);

    //
    audio_client.stopStream();
    midi_client.closePort();
#if defined(ADLJACK_ENABLE_VIRTUALMIDI)
    vmidi_port.reset();
#endif

    return 0;
}